

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifMv.c
# Opt level: O0

Abc_Des_t * Io_MvParse(Io_MvMan_t *p)

{
  Abc_Des_t *pAVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Io_MvMod_t *p_00;
  char *pcVar7;
  Abc_Obj_t *pAVar8;
  Vec_Ptr_t *pVVar9;
  Vec_Int_t *pVVar10;
  char *pFileName;
  Abc_Obj_t *pObj;
  Vec_Int_t *vLine;
  int k;
  int i;
  char *pLine;
  Io_MvMod_t *pMod;
  Abc_Des_t *pDesign;
  Io_MvMan_t *p_local;
  
  vLine._4_4_ = 0;
  do {
    iVar2 = Vec_PtrSize(p->vModels);
    if (iVar2 <= vLine._4_4_) {
      if (p->nNDnodes != 0) {
        printf("Warning: The parser added %d constant 0 nodes to replace non-deterministic nodes.\n"
               ,(ulong)(uint)p->nNDnodes);
      }
      pAVar1 = p->pDesign;
      p->pDesign = (Abc_Des_t *)0x0;
      return pAVar1;
    }
    p_00 = (Io_MvMod_t *)Vec_PtrEntry(p->vModels,vLine._4_4_);
    iVar2 = Vec_PtrSize(p_00->vMvs);
    if (0 < iVar2) {
      Abc_NtkStartMvVars(p_00->pNtk);
    }
    for (vLine._0_4_ = 0; iVar2 = Vec_PtrSize(p_00->vMvs), (int)vLine < iVar2;
        vLine._0_4_ = (int)vLine + 1) {
      pcVar7 = (char *)Vec_PtrEntry(p_00->vMvs,(int)vLine);
      iVar2 = Io_MvParseLineMv(p_00,pcVar7);
      if (iVar2 == 0) {
        return (Abc_Des_t *)0x0;
      }
    }
    iVar2 = Vec_PtrSize(p_00->vResets);
    if (0 < iVar2) {
      iVar2 = Vec_PtrSize(p_00->vLatches);
      iVar3 = Vec_PtrSize(p_00->vResets);
      if (iVar2 != iVar3) {
        uVar4 = Io_MvGetLine(p,p_00->pName);
        pcVar7 = Abc_NtkName(p_00->pNtk);
        uVar5 = Vec_PtrSize(p_00->vLatches);
        uVar6 = Vec_PtrSize(p_00->vResets);
        sprintf(p->sError,
                "Line %d: Model %s has different number of latches (%d) and reset nodes (%d).",
                (ulong)uVar4,pcVar7,(ulong)uVar5,(ulong)uVar6);
        return (Abc_Des_t *)0x0;
      }
      if (p->fUseReset != 0) {
        pAVar8 = Io_ReadCreateResetLatch(p_00->pNtk,p->fBlifMv);
        p_00->pResetLatch = pAVar8;
      }
    }
    for (vLine._0_4_ = 0; iVar2 = Vec_PtrSize(p_00->vFlops), (int)vLine < iVar2;
        vLine._0_4_ = (int)vLine + 1) {
      pcVar7 = (char *)Vec_PtrEntry(p_00->vFlops,(int)vLine);
      iVar2 = Io_MvParseLineFlop(p_00,pcVar7);
      if (iVar2 == 0) {
        return (Abc_Des_t *)0x0;
      }
    }
    for (vLine._0_4_ = 0; iVar2 = Vec_PtrSize(p_00->vLatches), (int)vLine < iVar2;
        vLine._0_4_ = (int)vLine + 1) {
      pcVar7 = (char *)Vec_PtrEntry(p_00->vLatches,(int)vLine);
      iVar2 = Io_MvParseLineLatch(p_00,pcVar7);
      if (iVar2 == 0) {
        return (Abc_Des_t *)0x0;
      }
    }
    if (p->fUseReset != 0) {
      for (vLine._0_4_ = 0; iVar2 = Vec_PtrSize(p_00->vResets), (int)vLine < iVar2;
          vLine._0_4_ = (int)vLine + 1) {
        pcVar7 = (char *)Vec_PtrEntry(p_00->vResets,(int)vLine);
        iVar2 = Io_MvParseLineNamesMv(p_00,pcVar7,1);
        if (iVar2 == 0) {
          return (Abc_Des_t *)0x0;
        }
      }
    }
    if (p->fBlifMv == 0) {
      for (vLine._0_4_ = 0; iVar2 = Vec_PtrSize(p_00->vNames), (int)vLine < iVar2;
          vLine._0_4_ = (int)vLine + 1) {
        pcVar7 = (char *)Vec_PtrEntry(p_00->vNames,(int)vLine);
        iVar2 = Io_MvParseLineNamesBlif(p_00,pcVar7);
        if (iVar2 == 0) {
          return (Abc_Des_t *)0x0;
        }
      }
      for (vLine._0_4_ = 0; iVar2 = Vec_PtrSize(p_00->vShorts), (int)vLine < iVar2;
          vLine._0_4_ = (int)vLine + 1) {
        pcVar7 = (char *)Vec_PtrEntry(p_00->vShorts,(int)vLine);
        iVar2 = Io_MvParseLineShortBlif(p_00,pcVar7);
        if (iVar2 == 0) {
          return (Abc_Des_t *)0x0;
        }
      }
    }
    else {
      for (vLine._0_4_ = 0; iVar2 = Vec_PtrSize(p_00->vNames), (int)vLine < iVar2;
          vLine._0_4_ = (int)vLine + 1) {
        pcVar7 = (char *)Vec_PtrEntry(p_00->vNames,(int)vLine);
        iVar2 = Io_MvParseLineNamesMv(p_00,pcVar7,0);
        if (iVar2 == 0) {
          return (Abc_Des_t *)0x0;
        }
      }
    }
    for (vLine._0_4_ = 0; iVar2 = Vec_PtrSize(p_00->vSubckts), (int)vLine < iVar2;
        vLine._0_4_ = (int)vLine + 1) {
      pcVar7 = (char *)Vec_PtrEntry(p_00->vSubckts,(int)vLine);
      iVar2 = Io_MvParseLineSubckt(p_00,pcVar7);
      if (iVar2 == 0) {
        return (Abc_Des_t *)0x0;
      }
    }
    iVar2 = Abc_NtkLatchNum(p_00->pNtk);
    if ((((iVar2 == 0) && (iVar2 = Abc_NtkNodeNum(p_00->pNtk), iVar2 == 0)) &&
        (iVar2 = Abc_NtkBoxNum(p_00->pNtk), iVar2 == 0)) && (p_00->pNtk->ntkFunc == ABC_FUNC_SOP)) {
      Mem_FlexStop((Mem_Flex_t *)p_00->pNtk->pManFunc,0);
      p_00->pNtk->pManFunc = (void *)0x0;
      p_00->pNtk->ntkFunc = ABC_FUNC_BLACKBOX;
    }
    Abc_NtkFinalizeRead(p_00->pNtk);
    iVar2 = Vec_PtrSize(p_00->vOnehots);
    if (0 < iVar2) {
      for (vLine._0_4_ = 0; iVar2 = Vec_PtrSize(p_00->pNtk->vBoxes), (int)vLine < iVar2;
          vLine._0_4_ = (int)vLine + 1) {
        pAVar8 = Abc_NtkBox(p_00->pNtk,(int)vLine);
        iVar2 = Abc_ObjIsLatch(pAVar8);
        if (iVar2 != 0) {
          pAVar8->pNext = (Abc_Obj_t *)(long)(int)vLine;
        }
      }
      iVar2 = Vec_PtrSize(p_00->vOnehots);
      pVVar9 = Vec_PtrAlloc(iVar2);
      p_00->pNtk->vOnehots = pVVar9;
      for (vLine._0_4_ = 0; iVar2 = Vec_PtrSize(p_00->vOnehots), (int)vLine < iVar2;
          vLine._0_4_ = (int)vLine + 1) {
        pcVar7 = (char *)Vec_PtrEntry(p_00->vOnehots,(int)vLine);
        pVVar10 = Io_MvParseLineOnehot(p_00,pcVar7);
        if (pVVar10 == (Vec_Int_t *)0x0) {
          return (Abc_Des_t *)0x0;
        }
        Vec_PtrPush(p_00->pNtk->vOnehots,pVVar10);
      }
      for (vLine._0_4_ = 0; iVar2 = Vec_PtrSize(p_00->pNtk->vBoxes), (int)vLine < iVar2;
          vLine._0_4_ = (int)vLine + 1) {
        pAVar8 = Abc_NtkBox(p_00->pNtk,(int)vLine);
        iVar2 = Abc_ObjIsLatch(pAVar8);
        if (iVar2 != 0) {
          pAVar8->pNext = (Abc_Obj_t *)0x0;
        }
      }
      uVar4 = Vec_PtrSize(p_00->pNtk->vOnehots);
      printf("Parsed %d groups of 1-hot registers: { ",(ulong)uVar4);
      for (vLine._0_4_ = 0; iVar2 = Vec_PtrSize(p_00->pNtk->vOnehots), (int)vLine < iVar2;
          vLine._0_4_ = (int)vLine + 1) {
        pVVar10 = (Vec_Int_t *)Vec_PtrEntry(p_00->pNtk->vOnehots,(int)vLine);
        uVar4 = Vec_IntSize(pVVar10);
        printf("%d ",(ulong)uVar4);
      }
      printf("}\n");
      uVar4 = Vec_VecSizeSize((Vec_Vec_t *)p_00->pNtk->vOnehots);
      iVar2 = Vec_VecSizeSize((Vec_Vec_t *)p_00->pNtk->vOnehots);
      iVar3 = Abc_NtkLatchNum(p_00->pNtk);
      printf("The total number of 1-hot registers = %d. (%.2f %%)\n",
             ((double)iVar2 * 100.0) / (double)iVar3,(ulong)uVar4);
      pcVar7 = Extra_FileNameGenericAppend(p_00->pMan->pFileName,"_1h.blif");
      iVar2 = Abc_NtkPiNum(p_00->pNtk);
      iVar3 = Abc_NtkLatchNum(p_00->pNtk);
      Abc_GenOneHotIntervals(pcVar7,iVar2,iVar3,p_00->pNtk->vOnehots);
      printf("One-hotness condition is written into file \"%s\".\n");
    }
    iVar2 = Vec_PtrSize(p_00->vFlops);
    if (iVar2 != 0) {
      Vec_PtrSize(p_00->vFlops);
      printf("Warning: The parser converted %d .flop lines into .latch lines\n");
      printf("(information about set, reset, enable of the flops may be lost).\n");
    }
    vLine._4_4_ = vLine._4_4_ + 1;
  } while( true );
}

Assistant:

static Abc_Des_t * Io_MvParse( Io_MvMan_t * p )
{
    Abc_Des_t * pDesign;
    Io_MvMod_t * pMod;
    char * pLine;
    int i, k;
    // iterate through the models
    Vec_PtrForEachEntry( Io_MvMod_t *, p->vModels, pMod, i )
    { 
#ifdef IO_VERBOSE_OUTPUT
        if ( Vec_PtrSize(p->vModels) > 1 )
            printf( "Parsing model %s...\n", pMod->pNtk->pName );
#endif

        // check if there any MV lines
        if ( Vec_PtrSize(pMod->vMvs) > 0 )
            Abc_NtkStartMvVars( pMod->pNtk );
        // parse the mv lines
        Vec_PtrForEachEntry( char *, pMod->vMvs, pLine, k )
            if ( !Io_MvParseLineMv( pMod, pLine ) )
                return NULL;
        // if reset lines are used there should be the same number of them as latches
        if ( Vec_PtrSize(pMod->vResets) > 0 )
        {
            if ( Vec_PtrSize(pMod->vLatches) != Vec_PtrSize(pMod->vResets) )
            {
                sprintf( p->sError, "Line %d: Model %s has different number of latches (%d) and reset nodes (%d).", 
                    Io_MvGetLine(p, pMod->pName), Abc_NtkName(pMod->pNtk), Vec_PtrSize(pMod->vLatches), Vec_PtrSize(pMod->vResets) );
                return NULL;
            }
            // create binary latch with 1-data and 0-init
            if ( p->fUseReset ) 
                pMod->pResetLatch = Io_ReadCreateResetLatch( pMod->pNtk, p->fBlifMv );
        }
        // parse the flops
        Vec_PtrForEachEntry( char *, pMod->vFlops, pLine, k )
            if ( !Io_MvParseLineFlop( pMod, pLine ) )
                return NULL;
        // parse the latches
        Vec_PtrForEachEntry( char *, pMod->vLatches, pLine, k )
            if ( !Io_MvParseLineLatch( pMod, pLine ) )
                return NULL;
        // parse the reset lines
        if ( p->fUseReset )
            Vec_PtrForEachEntry( char *, pMod->vResets, pLine, k )
                if ( !Io_MvParseLineNamesMv( pMod, pLine, 1 ) )
                    return NULL;
        // parse the nodes
        if ( p->fBlifMv )
        {
            Vec_PtrForEachEntry( char *, pMod->vNames, pLine, k )
                if ( !Io_MvParseLineNamesMv( pMod, pLine, 0 ) )
                    return NULL;
        }
        else
        {
            Vec_PtrForEachEntry( char *, pMod->vNames, pLine, k )
                if ( !Io_MvParseLineNamesBlif( pMod, pLine ) )
                    return NULL;
            Vec_PtrForEachEntry( char *, pMod->vShorts, pLine, k )
                if ( !Io_MvParseLineShortBlif( pMod, pLine ) )
                    return NULL;
        }
        // parse the subcircuits
        Vec_PtrForEachEntry( char *, pMod->vSubckts, pLine, k )
            if ( !Io_MvParseLineSubckt( pMod, pLine ) )
                return NULL;

        // allow for blackboxes without .blackbox line
        if ( Abc_NtkLatchNum(pMod->pNtk) == 0 && Abc_NtkNodeNum(pMod->pNtk) == 0 && Abc_NtkBoxNum(pMod->pNtk) == 0 )
        {
            if ( pMod->pNtk->ntkFunc == ABC_FUNC_SOP )
            {
                Mem_FlexStop( (Mem_Flex_t *)pMod->pNtk->pManFunc, 0 );
                pMod->pNtk->pManFunc = NULL;
                pMod->pNtk->ntkFunc = ABC_FUNC_BLACKBOX;
            }
        }

        // finalize the network
        Abc_NtkFinalizeRead( pMod->pNtk );
        // read the one-hotness lines
        if ( Vec_PtrSize(pMod->vOnehots) > 0 )
        {
            Vec_Int_t * vLine; 
            Abc_Obj_t * pObj;
            // set register numbers
            Abc_NtkForEachLatch( pMod->pNtk, pObj, k )
                pObj->pNext = (Abc_Obj_t *)(ABC_PTRINT_T)k;
            // derive register
            pMod->pNtk->vOnehots = Vec_PtrAlloc( Vec_PtrSize(pMod->vOnehots) );
            Vec_PtrForEachEntry( char *, pMod->vOnehots, pLine, k )
            {
                vLine = Io_MvParseLineOnehot( pMod, pLine );
                if ( vLine == NULL )
                    return NULL;
                Vec_PtrPush( pMod->pNtk->vOnehots, vLine );
//                printf( "Parsed %d one-hot registers.\n", Vec_IntSize(vLine) );
            }
            // reset register numbers
            Abc_NtkForEachLatch( pMod->pNtk, pObj, k )
                pObj->pNext = NULL;
            // print the result
            printf( "Parsed %d groups of 1-hot registers: { ", Vec_PtrSize(pMod->pNtk->vOnehots) );
            Vec_PtrForEachEntry( Vec_Int_t *, pMod->pNtk->vOnehots, vLine, k )
                printf( "%d ", Vec_IntSize(vLine) );
            printf( "}\n" );
            printf( "The total number of 1-hot registers = %d. (%.2f %%)\n", 
                Vec_VecSizeSize( (Vec_Vec_t *)pMod->pNtk->vOnehots ), 
                100.0 * Vec_VecSizeSize( (Vec_Vec_t *)pMod->pNtk->vOnehots ) / Abc_NtkLatchNum(pMod->pNtk) );
            {
                extern void Abc_GenOneHotIntervals( char * pFileName, int nPis, int nRegs, Vec_Ptr_t * vOnehots );
                char * pFileName = Extra_FileNameGenericAppend( pMod->pMan->pFileName, "_1h.blif" );
                Abc_GenOneHotIntervals( pFileName, Abc_NtkPiNum(pMod->pNtk), Abc_NtkLatchNum(pMod->pNtk), pMod->pNtk->vOnehots );
                printf( "One-hotness condition is written into file \"%s\".\n", pFileName );
            }
        }
        if ( Vec_PtrSize(pMod->vFlops) )
        {
            printf( "Warning: The parser converted %d .flop lines into .latch lines\n", Vec_PtrSize(pMod->vFlops) );
            printf( "(information about set, reset, enable of the flops may be lost).\n" );
        }

    }
    if ( p->nNDnodes )
//        printf( "Warning: The parser added %d PIs to replace non-deterministic nodes.\n", p->nNDnodes );
        printf( "Warning: The parser added %d constant 0 nodes to replace non-deterministic nodes.\n", p->nNDnodes );
    // return the network
    pDesign = p->pDesign;
    p->pDesign = NULL;
    return pDesign;
}